

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  uint32_t uVar1;
  size_t in_RCX;
  char *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int __flags;
  char *in_R8;
  int local_540;
  bool local_539;
  int local_538;
  bool _kj_shouldLog_6;
  undefined1 local_530 [7];
  bool _kj_shouldLog_5;
  uint32_t local_4ec [2];
  bool local_4e1;
  undefined1 local_4e0 [7];
  bool _kj_shouldLog_4;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_4a0;
  uint32_t local_45c [2];
  bool local_451;
  undefined1 local_450 [7];
  bool _kj_shouldLog_3;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_410;
  uint32_t local_3cc [2];
  bool local_3c1;
  undefined1 local_3c0 [7];
  bool _kj_shouldLog_2;
  Maybe<capnp::MessageSize> local_380;
  Client local_368;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_350;
  undefined1 local_318 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  Client local_2c8;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_2b0;
  undefined1 local_278 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  bool local_235;
  uint32_t local_234;
  int iStack_230;
  bool _kj_shouldLog_1;
  bool local_229;
  undefined1 local_228 [7];
  bool _kj_shouldLog;
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  Client local_1d0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_1b8;
  undefined1 local_180 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  undefined1 local_f8 [8];
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  undefined1 local_b0 [8];
  Client caller;
  undefined1 local_88 [8];
  Client callee;
  int local_68;
  int callerCallCount;
  int calleeCallCount;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase148 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  local_68 = 0;
  callee._20_4_ = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&caller.field_0x10,&local_68);
  capnproto_test::capnp::test::TestTailCallee::Client::Client<capnp::_::TestTailCalleeImpl,void>
            ((Client *)local_88,(Own<capnp::_::TestTailCalleeImpl> *)&caller.field_0x10);
  kj::Own<capnp::_::TestTailCalleeImpl>::~Own
            ((Own<capnp::_::TestTailCalleeImpl> *)&caller.field_0x10);
  kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&request.hook.ptr,(int *)&callee.field_0x14);
  capnproto_test::capnp::test::TestTailCaller::Client::Client<capnp::_::TestTailCallerImpl,void>
            ((Client *)local_b0,(Own<capnp::_::TestTailCallerImpl> *)&request.hook.ptr);
  kj::Own<capnp::_::TestTailCallerImpl>::~Own
            ((Own<capnp::_::TestTailCallerImpl> *)&request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise.super_Pipeline._typeless.ops.disposer,(void *)0x0
            );
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_f8,(Client *)local_b0,
             (Maybe<capnp::MessageSize> *)&promise.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Builder::setI((Builder *)local_f8,0x1c8);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Builder::setCallee
            ((Builder *)local_f8,(Client *)local_88);
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
          *)&dependentCall0.super_Pipeline._typeless.ops.disposer,(int)local_f8,__buf,in_RCX,
         (int)in_R8);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            (&local_1d0,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>
              .super_PromiseBase.node.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)&response.hook.ptr,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_1b8,&local_1d0,(Maybe<capnp::MessageSize> *)&response.hook.ptr);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_180,(int)&local_1b8,__buf_00,in_RCX,(int)in_R8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_1b8);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)&response.hook.ptr);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_1d0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             local_228,&dependentCall0.super_Pipeline._typeless.ops.disposer);
  uVar1 = capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI((Reader *)local_228)
  ;
  if (uVar1 != 0x1c8) {
    local_229 = kj::_::Debug::shouldLog(ERROR);
    while (local_229 != false) {
      iStack_230 = 0x1c8;
      local_234 = capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI
                            ((Reader *)local_228);
      in_R8 = "failed: expected (456) == (response.getI())";
      kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xa7,ERROR,
                 "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
                 (char (*) [44])"failed: expected (456) == (response.getI())",
                 &stack0xfffffffffffffdd0,&local_234);
      local_229 = false;
    }
  }
  uVar1 = capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI((Reader *)local_228)
  ;
  __flags = (int)in_R8;
  __n = (char *)(ulong)uVar1;
  if (uVar1 != 0x1c8) {
    local_235 = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)in_R8, local_235 != false) {
      dependentCall1.super_Pipeline._typeless.ops.disposer._4_4_ = 0x1c8;
      dependentCall1.super_Pipeline._typeless.ops.disposer._0_4_ =
           capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI
                     ((Reader *)local_228);
      __n = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
      in_R8 = "failed: expected (456) == (response.getI())";
      kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xa8,ERROR,
                 "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
                 (char (*) [44])"failed: expected (456) == (response.getI())",
                 (int *)((long)&dependentCall1.super_Pipeline._typeless.ops.disposer + 4),
                 (uint *)&dependentCall1.super_Pipeline._typeless.ops.disposer);
      local_235 = false;
    }
  }
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            (&local_2c8,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>
              .super_PromiseBase.node.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&dependentCall2.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_2b0,&local_2c8,
             (Maybe<capnp::MessageSize> *)&dependentCall2.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_278,(int)&local_2b0,__buf_01,(size_t)__n,__flags);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_2b0);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&dependentCall2.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_2c8);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getC
            (&local_368,(Reader *)local_228);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_380,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_350,&local_368,&local_380);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_318,(int)&local_350,__buf_02,(size_t)__n,__flags);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_350);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_380);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_368);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3c0,local_180);
  uVar1 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    ((Reader *)local_3c0);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            ((Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_3c0);
  if (uVar1 != 0) {
    local_3c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c1 != false) {
      local_3cc[1] = 0;
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_410,local_180);
      local_3cc[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_410.super_Reader);
      kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xae,ERROR,
                 "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", 0, dependentCall0.wait(waitScope).getN()"
                 ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
                 (int *)(local_3cc + 1),local_3cc);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_410);
      local_3c1 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_450,local_278);
  uVar1 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    ((Reader *)local_450);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            ((Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_450);
  if (uVar1 != 1) {
    local_451 = kj::_::Debug::shouldLog(ERROR);
    while (local_451 != false) {
      local_45c[1] = 1;
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_4a0,local_278);
      local_45c[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_4a0.super_Reader);
      kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xaf,ERROR,
                 "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", 1, dependentCall1.wait(waitScope).getN()"
                 ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
                 (int *)(local_45c + 1),local_45c);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_4a0);
      local_451 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_4e0,local_318);
  uVar1 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    ((Reader *)local_4e0);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            ((Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_4e0);
  if (uVar1 != 2) {
    local_4e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4e1 != false) {
      local_4ec[1] = 2;
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)local_530,local_318);
      local_4ec[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN((Reader *)local_530);
      kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", 2, dependentCall2.wait(waitScope).getN()"
                 ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
                 (int *)(local_4ec + 1),local_4ec);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                ((Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
                 local_530);
      local_4e1 = false;
    }
  }
  if (local_68 != 1) {
    _kj_shouldLog_6 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_6 != false) {
      local_538 = 1;
      kj::_::Debug::log<char_const(&)[42],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"(1) == (calleeCallCount)\", 1, calleeCallCount",
                 (char (*) [42])"failed: expected (1) == (calleeCallCount)",&local_538,&local_68);
      _kj_shouldLog_6 = false;
    }
  }
  if (callee._20_4_ != 1) {
    local_539 = kj::_::Debug::shouldLog(ERROR);
    while (local_539 != false) {
      local_540 = 1;
      kj::_::Debug::log<char_const(&)[42],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0xb3,ERROR,
                 "\"failed: expected \" \"(1) == (callerCallCount)\", 1, callerCallCount",
                 (char (*) [42])"failed: expected (1) == (callerCallCount)",&local_540,
                 (int *)&callee.field_0x14);
      local_539 = false;
    }
  }
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_318);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_278);
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult>::~Response
            ((Response<capnproto_test::capnp::test::TestTailCallee::TailResult> *)local_228);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_180);
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> *)
             &dependentCall0.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::~Request((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_f8);
  capnproto_test::capnp::test::TestTailCaller::Client::~Client((Client *)local_b0);
  capnproto_test::capnp::test::TestTailCallee::Client::~Client((Client *)local_88);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, TailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller(kj::heap<TestTailCallerImpl>(callerCallCount));

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}